

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O3

void __thiscall FxDamageValue::FxDamageValue(FxDamageValue *this,FxExpression *v,bool calc)

{
  int iVar1;
  undefined7 in_register_00000011;
  
  FxExpression::FxExpression(&this->super_FxExpression,&v->ScriptPosition);
  (this->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxDamageValue_0088f240;
  this->val = v;
  (this->super_FxExpression).ValueType = &TypeVoid->super_PType;
  this->Calculated = calc;
  this->MyFunction = (VMScriptFunction *)0x0;
  if ((int)CONCAT71(in_register_00000011,calc) == 0) {
    iVar1 = (*v->_vptr_FxExpression[3])(v);
    if ((char)iVar1 == '\0') {
      __assert_fail("v->isConstant() && \"Non-calculated damage must be constant\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                    ,0x1476,"FxDamageValue::FxDamageValue(FxExpression *, bool)");
    }
  }
  return;
}

Assistant:

FxDamageValue::FxDamageValue(FxExpression *v, bool calc)
: FxExpression(v->ScriptPosition)
{
	val = v;
	ValueType = TypeVoid;
	Calculated = calc;
	MyFunction = NULL;

	if (!calc)
	{
		assert(v->isConstant() && "Non-calculated damage must be constant");
	}
}